

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_bc7enc.cpp
# Opt level: O0

uint64_t basisu::color_cell_compression_est_astc
                   (uint32_t num_weights,uint32_t num_comps,uint32_t *pWeight_table,
                   uint32_t num_pixels,color_quad_u8 *pPixels,uint64_t best_err_so_far,
                   uint32_t *weights)

{
  uint32_t uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  uint in_ECX;
  long lVar6;
  int *in_RDX;
  int in_ESI;
  uint in_EDI;
  long in_R8;
  ulong in_R9;
  uint *in_stack_00000008;
  int db_3;
  int dg_3;
  int dr_3;
  color_quad_u8 *pE1_3;
  int j_3;
  uint32_t s_3;
  int d_3;
  color_quad_u8 *pC_5;
  uint32_t i_9;
  int da_1;
  int db_2;
  int dg_2;
  int dr_2;
  color_quad_u8 *pE1_2;
  int j_2;
  uint32_t s_2;
  int d_2;
  color_quad_u8 *pC_4;
  uint32_t i_8;
  int db_1;
  int dg_1;
  int dr_1;
  color_quad_u8 *pE1_1;
  int j_1;
  uint32_t s_1;
  int d_1;
  color_quad_u8 *pC_3;
  uint32_t i_7;
  int da;
  int db;
  int dg;
  int dr;
  color_quad_u8 *pE1;
  int j;
  uint32_t s;
  int d;
  color_quad_u8 *pC_2;
  uint32_t i_6;
  uint64_t total_err;
  uint32_t i_5;
  int thresh [31];
  uint32_t i_4;
  uint32_t i_3;
  int dots [32];
  int aa;
  int ab;
  int ag;
  int ar;
  uint32_t i_2;
  color_quad_u8 weightedColors [32];
  color_quad_u8 highColor;
  color_quad_u8 lowColor;
  color_quad_u8 *pC_1;
  uint32_t i_1;
  color_quad_u8 *pC;
  uint32_t i;
  uint32_t ha;
  uint32_t hb;
  uint32_t hg;
  uint32_t hr;
  uint32_t la;
  uint32_t lb;
  uint32_t lg;
  uint32_t lr;
  int32_t in_stack_fffffffffffffce8;
  int32_t in_stack_fffffffffffffcec;
  undefined1 in_stack_fffffffffffffcf0;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined4 in_stack_fffffffffffffcf4;
  int local_2f4;
  uint local_2f0;
  uint local_2dc;
  int local_2bc;
  uint local_2b8;
  uint local_2a8;
  int local_28c;
  uint local_288;
  uint local_274;
  int local_254;
  uint local_250;
  uint local_23c;
  ulong local_238;
  uint local_22c;
  int aiStack_228 [34];
  uint local_1a0;
  uint local_19c;
  int aiStack_198 [35];
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  uint local_fc;
  undefined4 local_f8;
  uint local_70;
  uint local_6c;
  byte *local_68;
  uint local_5c;
  byte *local_58;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  ulong local_28;
  long local_20;
  uint local_14;
  int *local_10;
  int local_8;
  uint local_4;
  
  uVar9 = in_ESI == 3 || in_ESI == 4;
  if (in_ESI != 3 && in_ESI != 4) {
    __assert_fail("num_comps == 3 || num_comps == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x6ef,
                  "uint64_t basisu::color_cell_compression_est_astc(uint32_t, uint32_t, const uint32_t *, uint32_t, const color_quad_u8 *, uint64_t, const uint32_t *)"
                 );
  }
  uVar8 = in_EDI != 0 && in_EDI < 0x21;
  if (in_EDI == 0 || in_EDI >= 0x21) {
    __assert_fail("num_weights >= 1 && num_weights <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x6f0,
                  "uint64_t basisu::color_cell_compression_est_astc(uint32_t, uint32_t, const uint32_t *, uint32_t, const color_quad_u8 *, uint64_t, const uint32_t *)"
                 );
  }
  uVar7 = false;
  if (*in_RDX == 0) {
    uVar7 = in_RDX[in_EDI - 1] == 0x40;
  }
  if ((bool)uVar7 == false) {
    __assert_fail("pWeight_table[0] == 0 && pWeight_table[num_weights - 1] == 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x6f1,
                  "uint64_t basisu::color_cell_compression_est_astc(uint32_t, uint32_t, const uint32_t *, uint32_t, const color_quad_u8 *, uint64_t, const uint32_t *)"
                 );
  }
  local_2c = 0xff;
  local_30 = 0xff;
  local_34 = 0xff;
  local_38 = 0xff;
  local_3c = 0;
  local_40 = 0;
  local_44 = 0;
  local_48 = 0;
  if (in_ESI == 4) {
    for (local_4c = 0; local_4c < in_ECX; local_4c = local_4c + 1) {
      local_58 = (byte *)(in_R8 + (ulong)local_4c * 4);
      if (*local_58 < local_2c) {
        local_2c = (uint)*local_58;
      }
      if (local_58[1] < local_30) {
        local_30 = (uint)local_58[1];
      }
      if (local_58[2] < local_34) {
        local_34 = (uint)local_58[2];
      }
      if (local_58[3] < local_38) {
        local_38 = (uint)local_58[3];
      }
      if (local_3c < *local_58) {
        local_3c = (uint)*local_58;
      }
      if (local_40 < local_58[1]) {
        local_40 = (uint)local_58[1];
      }
      if (local_44 < local_58[2]) {
        local_44 = (uint)local_58[2];
      }
      if (local_48 < local_58[3]) {
        local_48 = (uint)local_58[3];
      }
    }
  }
  else {
    for (local_5c = 0; local_5c < in_ECX; local_5c = local_5c + 1) {
      local_68 = (byte *)(in_R8 + (ulong)local_5c * 4);
      if (*local_68 < local_2c) {
        local_2c = (uint)*local_68;
      }
      if (local_68[1] < local_30) {
        local_30 = (uint)local_68[1];
      }
      if (local_68[2] < local_34) {
        local_34 = (uint)local_68[2];
      }
      if (local_3c < *local_68) {
        local_3c = (uint)*local_68;
      }
      if (local_40 < local_68[1]) {
        local_40 = (uint)local_68[1];
      }
      if (local_44 < local_68[2]) {
        local_44 = (uint)local_68[2];
      }
    }
    local_38 = 0xff;
    local_48 = 0xff;
  }
  local_28 = in_R9;
  local_20 = in_R8;
  local_14 = in_ECX;
  local_10 = in_RDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  color_quad_u8_set((color_quad_u8 *)
                    CONCAT44(in_stack_fffffffffffffcf4,
                             CONCAT13(uVar9,CONCAT12(uVar8,CONCAT11(uVar7,in_stack_fffffffffffffcf0)
                                                    ))),in_stack_fffffffffffffcec,
                    in_stack_fffffffffffffce8,0,0x4a9bea);
  color_quad_u8_set((color_quad_u8 *)
                    CONCAT44(in_stack_fffffffffffffcf4,
                             CONCAT13(uVar9,CONCAT12(uVar8,CONCAT11(uVar7,in_stack_fffffffffffffcf0)
                                                    ))),in_stack_fffffffffffffcec,
                    in_stack_fffffffffffffce8,0,0x4a9c14);
  local_f8 = local_6c;
  (&local_f8)[local_4 - 1] = local_70;
  for (local_fc = 1; local_fc < local_4 - 1; local_fc = local_fc + 1) {
    uVar1 = astc_interpolate_linear(local_6c & 0xff,local_70 & 0xff,local_10[local_fc]);
    *(char *)(&local_f8 + local_fc) = (char)uVar1;
    uVar1 = astc_interpolate_linear(local_6c >> 8 & 0xff,local_70 >> 8 & 0xff,local_10[local_fc]);
    *(char *)((long)&local_f8 + (ulong)local_fc * 4 + 1) = (char)uVar1;
    uVar1 = astc_interpolate_linear
                      (local_6c >> 0x10 & 0xff,local_70 >> 0x10 & 0xff,local_10[local_fc]);
    *(char *)((long)&local_f8 + (ulong)local_fc * 4 + 2) = (char)uVar1;
    if (local_8 == 4) {
      uVar1 = astc_interpolate_linear(local_6c >> 0x18,local_70 >> 0x18,local_10[local_fc]);
      uVar9 = (undefined1)uVar1;
    }
    else {
      uVar9 = 0xff;
    }
    *(undefined1 *)((long)&local_f8 + (ulong)local_fc * 4 + 3) = uVar9;
  }
  local_100 = (local_70 & 0xff) - (local_6c & 0xff);
  local_104 = (local_70 >> 8 & 0xff) - (local_6c >> 8 & 0xff);
  local_108 = (local_70 >> 0x10 & 0xff) - (local_6c >> 0x10 & 0xff);
  local_10c = (local_70 >> 0x18) - (local_6c >> 0x18);
  if (local_8 == 4) {
    for (local_19c = 0; local_19c < local_4; local_19c = local_19c + 1) {
      aiStack_198[local_19c] =
           (uint)*(byte *)(&local_f8 + local_19c) * local_100 +
           (uint)*(byte *)((long)&local_f8 + (ulong)local_19c * 4 + 1) * local_104 +
           (uint)*(byte *)((long)&local_f8 + (ulong)local_19c * 4 + 2) * local_108 +
           (uint)*(byte *)((long)&local_f8 + (ulong)local_19c * 4 + 3) * local_10c;
    }
  }
  else {
    if (local_10c != 0) {
      __assert_fail("aa == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                    ,0x736,
                    "uint64_t basisu::color_cell_compression_est_astc(uint32_t, uint32_t, const uint32_t *, uint32_t, const color_quad_u8 *, uint64_t, const uint32_t *)"
                   );
    }
    for (local_1a0 = 0; local_1a0 < local_4; local_1a0 = local_1a0 + 1) {
      aiStack_198[local_1a0] =
           (uint)*(byte *)(&local_f8 + local_1a0) * local_100 +
           (uint)*(byte *)((long)&local_f8 + (ulong)local_1a0 * 4 + 1) * local_104 +
           (uint)*(byte *)((long)&local_f8 + (ulong)local_1a0 * 4 + 2) * local_108;
    }
  }
  for (local_22c = 0; local_22c < local_4 - 1; local_22c = local_22c + 1) {
    aiStack_228[local_22c] = aiStack_198[local_22c] + aiStack_198[local_22c + 1] + 1 >> 1;
  }
  local_238 = 0;
  if ((*in_stack_00000008 | in_stack_00000008[1] | in_stack_00000008[2] | in_stack_00000008[3]) == 1
     ) {
    if (local_8 == 4) {
      for (local_23c = 0; local_23c < local_14; local_23c = local_23c + 1) {
        pbVar5 = (byte *)(local_20 + (ulong)local_23c * 4);
        local_250 = 0;
        for (local_254 = local_4 - 2; -1 < local_254; local_254 = local_254 + -1) {
          if (aiStack_228[local_254] <=
              (int)(local_100 * (uint)*pbVar5 + local_104 * (uint)pbVar5[1] +
                    local_108 * (uint)pbVar5[2] + local_10c * (uint)pbVar5[3])) {
            local_250 = local_254 + 1;
            break;
          }
        }
        lVar6 = (ulong)local_250 * 4;
        iVar2 = (uint)*(byte *)((long)&local_f8 + lVar6 + 1) - (uint)pbVar5[1];
        iVar3 = (uint)*(byte *)((long)&local_f8 + lVar6 + 2) - (uint)pbVar5[2];
        iVar4 = (uint)*(byte *)((long)&local_f8 + lVar6 + 3) - (uint)pbVar5[3];
        local_238 = (long)(int)(((uint)*(byte *)(&local_f8 + local_250) - (uint)*pbVar5) *
                                ((uint)*(byte *)(&local_f8 + local_250) - (uint)*pbVar5) +
                                iVar2 * iVar2 + iVar3 * iVar3 + iVar4 * iVar4) + local_238;
        if (local_28 < local_238) {
          return local_238;
        }
      }
    }
    else {
      for (local_274 = 0; local_274 < local_14; local_274 = local_274 + 1) {
        pbVar5 = (byte *)(local_20 + (ulong)local_274 * 4);
        local_288 = 0;
        for (local_28c = local_4 - 2; -1 < local_28c; local_28c = local_28c + -1) {
          if (aiStack_228[local_28c] <=
              (int)(local_100 * (uint)*pbVar5 + local_104 * (uint)pbVar5[1] +
                   local_108 * (uint)pbVar5[2])) {
            local_288 = local_28c + 1;
            break;
          }
        }
        lVar6 = (ulong)local_288 * 4;
        iVar2 = (uint)*(byte *)((long)&local_f8 + lVar6 + 1) - (uint)pbVar5[1];
        iVar3 = (uint)*(byte *)((long)&local_f8 + lVar6 + 2) - (uint)pbVar5[2];
        local_238 = (long)(int)(((uint)*(byte *)(&local_f8 + local_288) - (uint)*pbVar5) *
                                ((uint)*(byte *)(&local_f8 + local_288) - (uint)*pbVar5) +
                                iVar2 * iVar2 + iVar3 * iVar3) + local_238;
        if (local_28 < local_238) {
          return local_238;
        }
      }
    }
  }
  else if (local_8 == 4) {
    for (local_2a8 = 0; local_2a8 < local_14; local_2a8 = local_2a8 + 1) {
      pbVar5 = (byte *)(local_20 + (ulong)local_2a8 * 4);
      local_2b8 = 0;
      for (local_2bc = local_4 - 2; -1 < local_2bc; local_2bc = local_2bc + -1) {
        if (aiStack_228[local_2bc] <=
            (int)(local_100 * (uint)*pbVar5 + local_104 * (uint)pbVar5[1] +
                  local_108 * (uint)pbVar5[2] + local_10c * (uint)pbVar5[3])) {
          local_2b8 = local_2bc + 1;
          break;
        }
      }
      lVar6 = (ulong)local_2b8 * 4;
      iVar2 = (uint)*(byte *)((long)&local_f8 + lVar6 + 1) - (uint)pbVar5[1];
      iVar3 = (uint)*(byte *)((long)&local_f8 + lVar6 + 2) - (uint)pbVar5[2];
      iVar4 = (uint)*(byte *)((long)&local_f8 + lVar6 + 3) - (uint)pbVar5[3];
      local_238 = (*in_stack_00000008 *
                   ((uint)*(byte *)(&local_f8 + local_2b8) - (uint)*pbVar5) *
                   ((uint)*(byte *)(&local_f8 + local_2b8) - (uint)*pbVar5) +
                   in_stack_00000008[1] * iVar2 * iVar2 + in_stack_00000008[2] * iVar3 * iVar3 +
                  in_stack_00000008[3] * iVar4 * iVar4) + local_238;
      if (local_28 < local_238) {
        return local_238;
      }
    }
  }
  else {
    for (local_2dc = 0; local_2dc < local_14; local_2dc = local_2dc + 1) {
      pbVar5 = (byte *)(local_20 + (ulong)local_2dc * 4);
      local_2f0 = 0;
      for (local_2f4 = local_4 - 2; -1 < local_2f4; local_2f4 = local_2f4 + -1) {
        if (aiStack_228[local_2f4] <=
            (int)(local_100 * (uint)*pbVar5 + local_104 * (uint)pbVar5[1] +
                 local_108 * (uint)pbVar5[2])) {
          local_2f0 = local_2f4 + 1;
          break;
        }
      }
      lVar6 = (ulong)local_2f0 * 4;
      iVar2 = (uint)*(byte *)((long)&local_f8 + lVar6 + 1) - (uint)pbVar5[1];
      iVar3 = (uint)*(byte *)((long)&local_f8 + lVar6 + 2) - (uint)pbVar5[2];
      local_238 = (*in_stack_00000008 *
                   ((uint)*(byte *)(&local_f8 + local_2f0) - (uint)*pbVar5) *
                   ((uint)*(byte *)(&local_f8 + local_2f0) - (uint)*pbVar5) +
                   in_stack_00000008[1] * iVar2 * iVar2 + in_stack_00000008[2] * iVar3 * iVar3) +
                  local_238;
      if (local_28 < local_238) {
        return local_238;
      }
    }
  }
  return local_238;
}

Assistant:

uint64_t color_cell_compression_est_astc(
	uint32_t num_weights, uint32_t num_comps, const uint32_t *pWeight_table,
	uint32_t num_pixels, const color_quad_u8* pPixels, 
	uint64_t best_err_so_far, const uint32_t weights[4])
{
	assert(num_comps == 3 || num_comps == 4);
	assert(num_weights >= 1 && num_weights <= 32);
	assert(pWeight_table[0] == 0 && pWeight_table[num_weights - 1] == 64);

	// Find RGB bounds as an approximation of the block's principle axis
	uint32_t lr = 255, lg = 255, lb = 255, la = 255;
	uint32_t hr = 0, hg = 0, hb = 0, ha = 0;
	if (num_comps == 4)
	{
		for (uint32_t i = 0; i < num_pixels; i++)
		{
			const color_quad_u8* pC = &pPixels[i];
			if (pC->m_c[0] < lr) lr = pC->m_c[0];
			if (pC->m_c[1] < lg) lg = pC->m_c[1];
			if (pC->m_c[2] < lb) lb = pC->m_c[2];
			if (pC->m_c[3] < la) la = pC->m_c[3];

			if (pC->m_c[0] > hr) hr = pC->m_c[0];
			if (pC->m_c[1] > hg) hg = pC->m_c[1];
			if (pC->m_c[2] > hb) hb = pC->m_c[2];
			if (pC->m_c[3] > ha) ha = pC->m_c[3];
		}
	}
	else
	{
		for (uint32_t i = 0; i < num_pixels; i++)
		{
			const color_quad_u8* pC = &pPixels[i];
			if (pC->m_c[0] < lr) lr = pC->m_c[0];
			if (pC->m_c[1] < lg) lg = pC->m_c[1];
			if (pC->m_c[2] < lb) lb = pC->m_c[2];

			if (pC->m_c[0] > hr) hr = pC->m_c[0];
			if (pC->m_c[1] > hg) hg = pC->m_c[1];
			if (pC->m_c[2] > hb) hb = pC->m_c[2];
		}
		la = 255;
		ha = 255;
	}

	color_quad_u8 lowColor, highColor;
	color_quad_u8_set(&lowColor, lr, lg, lb, la);
	color_quad_u8_set(&highColor, hr, hg, hb, ha);

	// Place endpoints at bbox diagonals and compute interpolated colors 
	color_quad_u8 weightedColors[32];

	weightedColors[0] = lowColor;
	weightedColors[num_weights - 1] = highColor;
	for (uint32_t i = 1; i < (num_weights - 1); i++)
	{
		weightedColors[i].m_c[0] = (uint8_t)astc_interpolate_linear(lowColor.m_c[0], highColor.m_c[0], pWeight_table[i]);
		weightedColors[i].m_c[1] = (uint8_t)astc_interpolate_linear(lowColor.m_c[1], highColor.m_c[1], pWeight_table[i]);
		weightedColors[i].m_c[2] = (uint8_t)astc_interpolate_linear(lowColor.m_c[2], highColor.m_c[2], pWeight_table[i]);
		weightedColors[i].m_c[3] = (num_comps == 4) ? (uint8_t)astc_interpolate_linear(lowColor.m_c[3], highColor.m_c[3], pWeight_table[i]) : 255;
	}

	// Compute dots and thresholds
	const int ar = highColor.m_c[0] - lowColor.m_c[0];
	const int ag = highColor.m_c[1] - lowColor.m_c[1];
	const int ab = highColor.m_c[2] - lowColor.m_c[2];
	const int aa = highColor.m_c[3] - lowColor.m_c[3];

	int dots[32];
	if (num_comps == 4)
	{
		for (uint32_t i = 0; i < num_weights; i++)
			dots[i] = weightedColors[i].m_c[0] * ar + weightedColors[i].m_c[1] * ag + weightedColors[i].m_c[2] * ab + weightedColors[i].m_c[3] * aa;
	}
	else
	{
		assert(aa == 0);
		for (uint32_t i = 0; i < num_weights; i++)
			dots[i] = weightedColors[i].m_c[0] * ar + weightedColors[i].m_c[1] * ag + weightedColors[i].m_c[2] * ab;
	}

	int thresh[32 - 1];
	for (uint32_t i = 0; i < (num_weights - 1); i++)
		thresh[i] = (dots[i] + dots[i + 1] + 1) >> 1;

	uint64_t total_err = 0;
	if ((weights[0] | weights[1] | weights[2] | weights[3]) == 1)
	{
		if (num_comps == 4)
		{
			for (uint32_t i = 0; i < num_pixels; i++)
			{
				const color_quad_u8* pC = &pPixels[i];

				int d = ar * pC->m_c[0] + ag * pC->m_c[1] + ab * pC->m_c[2] + aa * pC->m_c[3];

				// Find approximate selector
				uint32_t s = 0;
				for (int j = num_weights - 2; j >= 0; j--)
				{
					if (d >= thresh[j])
					{
						s = j + 1;
						break;
					}
				}

				// Compute error
				const color_quad_u8* pE1 = &weightedColors[s];

				int dr = (int)pE1->m_c[0] - (int)pC->m_c[0];
				int dg = (int)pE1->m_c[1] - (int)pC->m_c[1];
				int db = (int)pE1->m_c[2] - (int)pC->m_c[2];
				int da = (int)pE1->m_c[3] - (int)pC->m_c[3];

				total_err += (dr * dr) + (dg * dg) + (db * db) + (da * da);
				if (total_err > best_err_so_far)
					break;
			}
		}
		else
		{
			for (uint32_t i = 0; i < num_pixels; i++)
			{
				const color_quad_u8* pC = &pPixels[i];

				int d = ar * pC->m_c[0] + ag * pC->m_c[1] + ab * pC->m_c[2];

				// Find approximate selector
				uint32_t s = 0;
				for (int j = num_weights - 2; j >= 0; j--)
				{
					if (d >= thresh[j])
					{
						s = j + 1;
						break;
					}
				}

				// Compute error
				const color_quad_u8* pE1 = &weightedColors[s];

				int dr = (int)pE1->m_c[0] - (int)pC->m_c[0];
				int dg = (int)pE1->m_c[1] - (int)pC->m_c[1];
				int db = (int)pE1->m_c[2] - (int)pC->m_c[2];

				total_err += (dr * dr) + (dg * dg) + (db * db);
				if (total_err > best_err_so_far)
					break;
			}
		}
	}
	else
	{
		if (num_comps == 4)
		{
			for (uint32_t i = 0; i < num_pixels; i++)
			{
				const color_quad_u8* pC = &pPixels[i];

				int d = ar * pC->m_c[0] + ag * pC->m_c[1] + ab * pC->m_c[2] + aa * pC->m_c[3];

				// Find approximate selector
				uint32_t s = 0;
				for (int j = num_weights - 2; j >= 0; j--)
				{
					if (d >= thresh[j])
					{
						s = j + 1;
						break;
					}
				}

				// Compute error
				const color_quad_u8* pE1 = &weightedColors[s];

				int dr = (int)pE1->m_c[0] - (int)pC->m_c[0];
				int dg = (int)pE1->m_c[1] - (int)pC->m_c[1];
				int db = (int)pE1->m_c[2] - (int)pC->m_c[2];
				int da = (int)pE1->m_c[3] - (int)pC->m_c[3];

				total_err += weights[0] * (dr * dr) + weights[1] * (dg * dg) + weights[2] * (db * db) + weights[3] * (da * da);
				if (total_err > best_err_so_far)
					break;
			}
		}
		else
		{
			for (uint32_t i = 0; i < num_pixels; i++)
			{
				const color_quad_u8* pC = &pPixels[i];

				int d = ar * pC->m_c[0] + ag * pC->m_c[1] + ab * pC->m_c[2];

				// Find approximate selector
				uint32_t s = 0;
				for (int j = num_weights - 2; j >= 0; j--)
				{
					if (d >= thresh[j])
					{
						s = j + 1;
						break;
					}
				}

				// Compute error
				const color_quad_u8* pE1 = &weightedColors[s];

				int dr = (int)pE1->m_c[0] - (int)pC->m_c[0];
				int dg = (int)pE1->m_c[1] - (int)pC->m_c[1];
				int db = (int)pE1->m_c[2] - (int)pC->m_c[2];

				total_err += weights[0] * (dr * dr) + weights[1] * (dg * dg) + weights[2] * (db * db);
				if (total_err > best_err_so_far)
					break;
			}
		}
	}

	return total_err;
}